

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O3

Status __thiscall
google::protobuf::compiler::java::ValidateNestInFileClassFeature
          (java *this,EnumDescriptor *descriptor)

{
  char *pcVar1;
  MessageLite *pMVar2;
  string_view message;
  string local_90;
  AlphaNum local_70;
  undefined8 local_40;
  char *local_38;
  
  if ((descriptor->containing_type_ != (Descriptor *)0x0) &&
     (pMVar2 = protobuf::internal::ExtensionSet::GetMessage
                         (&(descriptor->proto_features_->field_0)._impl_._extensions_,pb::java,
                          (MessageLite *)PTR__JavaFeatures_default_instance__01987248),
     ((ulong)pMVar2[1]._vptr_MessageLite & 0x10) != 0)) {
    local_40 = 0x74;
    local_38 = 
    "Feature pb.java.nest_in_file_class only applies to top-level types and is not allowed to be set on the nested type: "
    ;
    pcVar1 = (descriptor->all_names_).payload_;
    local_70.piece_._M_len = (size_t)*(ushort *)(pcVar1 + 2);
    local_70.piece_._M_str = pcVar1 + ~local_70.piece_._M_len;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_90,(lts_20250127 *)&local_40,&local_70,(AlphaNum *)local_70.piece_._M_str);
    message._M_str = (char *)local_90._M_string_length;
    message._M_len = (size_t)this;
    absl::lts_20250127::FailedPreconditionError(message);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) {
      return (Status)(uintptr_t)this;
    }
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    return (Status)(uintptr_t)this;
  }
  *(undefined8 *)this = 1;
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status ValidateNestInFileClassFeature(const EnumDescriptor& descriptor) {
  return ValidateNestInFileClassFeatureHelper(descriptor);
}